

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.h
# Opt level: O0

bool __thiscall Settings::load(Settings *this,char *file_name)

{
  __node_base_ptr p_Var1;
  bool bVar2;
  int iVar3;
  DebugStream *pDVar4;
  uint64_t uVar5;
  double dVar6;
  allocator local_f01;
  string local_f00 [39];
  allocator local_ed9;
  string local_ed8 [39];
  allocator local_eb1;
  string local_eb0 [39];
  allocator local_e89;
  string local_e88 [39];
  allocator local_e61;
  string local_e60 [39];
  allocator local_e39;
  string local_e38 [39];
  allocator local_e11;
  string local_e10 [32];
  undefined1 local_df0 [40];
  string local_dc8 [39];
  allocator local_da1;
  string local_da0 [39];
  allocator local_d79;
  string local_d78 [39];
  allocator local_d51;
  string local_d50 [39];
  allocator local_d29;
  string local_d28 [39];
  allocator local_d01;
  string local_d00 [39];
  allocator local_cd9;
  string local_cd8 [39];
  allocator local_cb1;
  string local_cb0 [39];
  allocator local_c89;
  string local_c88 [39];
  allocator local_c61;
  string local_c60 [39];
  allocator local_c39;
  string local_c38 [39];
  allocator local_c11;
  string local_c10 [39];
  allocator local_be9;
  string local_be8 [39];
  allocator local_bc1;
  string local_bc0 [39];
  allocator local_b99;
  string local_b98 [32];
  undefined1 local_b78 [40];
  string local_b50 [39];
  allocator local_b29;
  string local_b28 [39];
  allocator local_b01;
  string local_b00 [39];
  allocator local_ad9;
  string local_ad8 [39];
  allocator local_ab1;
  string local_ab0 [39];
  allocator local_a89;
  string local_a88 [39];
  allocator local_a61;
  string local_a60 [32];
  undefined1 local_a40 [40];
  string local_a18 [39];
  allocator local_9f1;
  string local_9f0 [39];
  allocator local_9c9;
  string local_9c8 [39];
  allocator local_9a1;
  string local_9a0 [39];
  allocator local_979;
  string local_978 [39];
  allocator local_951;
  string local_950 [39];
  allocator local_929;
  string local_928 [39];
  allocator local_901;
  string local_900 [39];
  allocator local_8d9;
  string local_8d8 [39];
  allocator local_8b1;
  string local_8b0 [39];
  allocator local_889;
  string local_888 [39];
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [32];
  undefined1 local_818 [40];
  string local_7f0 [39];
  allocator local_7c9;
  string local_7c8 [39];
  allocator local_7a1;
  string local_7a0 [39];
  allocator local_779;
  string local_778 [39];
  allocator local_751;
  string local_750 [39];
  allocator local_729;
  string local_728 [39];
  allocator local_701;
  string local_700 [39];
  allocator local_6d9;
  string local_6d8 [39];
  allocator local_6b1;
  string local_6b0 [39];
  allocator local_689;
  string local_688 [39];
  allocator local_661;
  string local_660 [39];
  allocator local_639;
  string local_638 [39];
  allocator local_611;
  string local_610 [39];
  allocator local_5e9;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [39];
  allocator local_599;
  string local_598 [39];
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [39];
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [39];
  string local_279;
  uint32_t local_278;
  allocator local_271;
  uint cores;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  undefined1 local_200 [40];
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [32];
  undefined1 local_168 [40];
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [32];
  undefined1 local_d0 [40];
  string local_a8 [35];
  string local_85 [20];
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  IniFile settingsFile;
  char *file_name_local;
  Settings *this_local;
  
  settingsFile.m_values._M_h._M_single_bucket = (__node_base_ptr)file_name;
  utils::IniFile::IniFile((IniFile *)local_50);
  p_Var1 = settingsFile.m_values._M_h._M_single_bucket;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,(char *)p_Var1,&local_71);
  bVar2 = utils::IniFile::readFile((IniFile *)local_50,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::operator<<((ostream *)&std::cerr,"Unable to load settings, using defaults");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"settings",(allocator *)(local_d0 + 0x27));
  debug(local_85);
  pDVar4 = DebugStream::operator<<((DebugStream *)local_85,"Loading settings file");
  DebugStream::operator<<(pDVar4,(char *)settingsFile.m_values._M_h._M_single_bucket);
  DebugStream::~DebugStream((DebugStream *)local_85);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)(local_d0 + 0x27));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"Load",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"usr_operator_path",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_140,"../build/usr_operators/libusr_operators.so",(allocator *)(local_168 + 0x27))
  ;
  utils::IniFile::getString
            ((IniFile *)local_d0,(string *)local_50,(string *)local_f0,(string *)local_118);
  std::__cxx11::string::operator=((string *)this,(string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)(local_168 + 0x27));
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"Load",&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"usr_class_path",&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1d8,"./V1.2/user.classes.replicode",(allocator *)(local_200 + 0x27));
  utils::IniFile::getString
            ((IniFile *)local_168,(string *)local_50,(string *)local_188,(string *)local_1b0);
  std::__cxx11::string::operator=((string *)&this->usr_class_path,(string *)local_168);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)(local_200 + 0x27));
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"Load",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"source_file_name",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&cores,"./V1.2/test.2.replicode",&local_271);
  utils::IniFile::getString
            ((IniFile *)local_200,(string *)local_50,(string *)local_220,(string *)local_248);
  std::__cxx11::string::operator=((string *)&this->source_file_name,(string *)local_200);
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::string::~string((string *)&cores);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  local_278 = std::thread::hardware_concurrency();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"settings",&local_2a1);
  debug(&local_279);
  pDVar4 = DebugStream::operator<<((DebugStream *)&local_279,"number of CPU cores available:");
  DebugStream::operator<<(pDVar4,local_278);
  DebugStream::~DebugStream((DebugStream *)&local_279);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"Init",&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"base_period",&local_2f1);
  uVar5 = utils::IniFile::getInt((IniFile *)local_50,(string *)local_2c8,(string *)local_2f0,50000);
  this->base_period = uVar5;
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"Init",&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"reduction_core_count",&local_341);
  uVar5 = utils::IniFile::getInt
                    ((IniFile *)local_50,(string *)local_318,(string *)local_340,
                     (ulong)((local_278 * 3 >> 2) + 1));
  this->reduction_core_count = uVar5;
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"Init",&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"time_core_count",&local_391);
  uVar5 = utils::IniFile::getInt
                    ((IniFile *)local_50,(string *)local_368,(string *)local_390,
                     (ulong)((local_278 + 1) - (local_278 * 3 >> 2)));
  this->time_core_count = uVar5;
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"System",&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"mdl_inertia_sr_thr",&local_3e1);
  dVar6 = utils::IniFile::getDouble((IniFile *)local_50,(string *)local_3b8,(string *)local_3e0,0.9)
  ;
  this->mdl_inertia_sr_thr = dVar6;
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"System",&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"mdl_inertia_cnt_thr",&local_431);
  uVar5 = utils::IniFile::getInt((IniFile *)local_50,(string *)local_408,(string *)local_430,6);
  this->mdl_inertia_cnt_thr = uVar5;
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"System",&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"tpx_dsr_thr",&local_481);
  dVar6 = utils::IniFile::getDouble((IniFile *)local_50,(string *)local_458,(string *)local_480,0.1)
  ;
  this->tpx_dsr_thr = dVar6;
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a8,"System",&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d0,"min_sim_time_horizon",&local_4d1);
  uVar5 = utils::IniFile::getInt((IniFile *)local_50,(string *)local_4a8,(string *)local_4d0,0);
  this->min_sim_time_horizon = uVar5;
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"System",&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"max_sim_time_horizon",&local_521);
  uVar5 = utils::IniFile::getInt((IniFile *)local_50,(string *)local_4f8,(string *)local_520,0);
  this->max_sim_time_horizon = uVar5;
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"System",&local_549);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"sim_time_horizon",&local_571);
  dVar6 = utils::IniFile::getDouble((IniFile *)local_50,(string *)local_548,(string *)local_570,0.3)
  ;
  this->sim_time_horizon = dVar6;
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_598,"System",&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c0,"tpx_time_horizon",&local_5c1);
  uVar5 = utils::IniFile::getInt((IniFile *)local_50,(string *)local_598,(string *)local_5c0,500000)
  ;
  this->tpx_time_horizon = uVar5;
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e8,"System",&local_5e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_610,"perf_sampling_period",&local_611);
  uVar5 = utils::IniFile::getInt((IniFile *)local_50,(string *)local_5e8,(string *)local_610,250000)
  ;
  this->perf_sampling_period = uVar5;
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_638,"System",&local_639);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_660,"float_tolerance",&local_661);
  dVar6 = utils::IniFile::getDouble
                    ((IniFile *)local_50,(string *)local_638,(string *)local_660,1e-05);
  this->float_tolerance = dVar6;
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator((allocator<char> *)&local_639);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_688,"System",&local_689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b0,"time_tolerance",&local_6b1);
  uVar5 = utils::IniFile::getInt((IniFile *)local_50,(string *)local_688,(string *)local_6b0,10000);
  this->time_tolerance = uVar5;
  std::__cxx11::string::~string(local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  std::__cxx11::string::~string(local_688);
  std::allocator<char>::~allocator((allocator<char> *)&local_689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d8,"System",&local_6d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_700,"primary_thz",&local_701);
  uVar5 = utils::IniFile::getInt
                    ((IniFile *)local_50,(string *)local_6d8,(string *)local_700,3600000);
  this->primary_thz = uVar5;
  std::__cxx11::string::~string(local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_728,"System",&local_729);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_750,"secondary_thz",&local_751);
  uVar5 = utils::IniFile::getInt
                    ((IniFile *)local_50,(string *)local_728,(string *)local_750,7200000);
  this->secondary_thz = uVar5;
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator((allocator<char> *)&local_751);
  std::__cxx11::string::~string(local_728);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_778,"Debug",&local_779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7a0,"debug",&local_7a1);
  iVar3 = utils::IniFile::getBool((IniFile *)local_50,(string *)local_778,(string *)local_7a0,true);
  this->debug = iVar3 != 0;
  std::__cxx11::string::~string(local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  std::__cxx11::string::~string(local_778);
  std::allocator<char>::~allocator((allocator<char> *)&local_779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c8,"Debug",&local_7c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f0,"debug_windows",(allocator *)(local_818 + 0x27));
  uVar5 = utils::IniFile::getInt((IniFile *)local_50,(string *)local_7c8,(string *)local_7f0,1);
  this->debug_windows = uVar5;
  std::__cxx11::string::~string(local_7f0);
  std::allocator<char>::~allocator((allocator<char> *)(local_818 + 0x27));
  std::__cxx11::string::~string(local_7c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"Debug",&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_860,"trace_levels",&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_888,"CC",&local_889);
  utils::IniFile::getString
            ((IniFile *)local_818,(string *)local_50,(string *)local_838,(string *)local_860);
  iVar3 = std::__cxx11::stoi((string *)local_818,(size_t *)0x0,0x10);
  this->trace_levels = (long)iVar3;
  std::__cxx11::string::~string((string *)local_818);
  std::__cxx11::string::~string(local_888);
  std::allocator<char>::~allocator((allocator<char> *)&local_889);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8b0,"Resilience",&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d8,"ntf_mk_resilience",&local_8d9);
  uVar5 = utils::IniFile::getInt((IniFile *)local_50,(string *)local_8b0,(string *)local_8d8,1);
  this->ntf_mk_resilience = uVar5;
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_900,"Resilience",&local_901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_928,"goal_pred_success_resilience",&local_929);
  uVar5 = utils::IniFile::getInt((IniFile *)local_50,(string *)local_900,(string *)local_928,1000);
  this->goal_pred_success_resilience = uVar5;
  std::__cxx11::string::~string(local_928);
  std::allocator<char>::~allocator((allocator<char> *)&local_929);
  std::__cxx11::string::~string(local_900);
  std::allocator<char>::~allocator((allocator<char> *)&local_901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_950,"Objects",&local_951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_978,"get_objects",&local_979);
  iVar3 = utils::IniFile::getBool((IniFile *)local_50,(string *)local_950,(string *)local_978,false)
  ;
  this->get_objects = iVar3 != 0;
  std::__cxx11::string::~string(local_978);
  std::allocator<char>::~allocator((allocator<char> *)&local_979);
  std::__cxx11::string::~string(local_950);
  std::allocator<char>::~allocator((allocator<char> *)&local_951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9a0,"Objects",&local_9a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c8,"decompile_objects",&local_9c9);
  iVar3 = utils::IniFile::getBool((IniFile *)local_50,(string *)local_9a0,(string *)local_9c8,false)
  ;
  this->decompile_objects = iVar3 != 0;
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
  std::__cxx11::string::~string(local_9a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f0,"Objects",&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a18,"decompile_to_file",(allocator *)(local_a40 + 0x27));
  iVar3 = utils::IniFile::getBool((IniFile *)local_50,(string *)local_9f0,(string *)local_a18,false)
  ;
  this->decompile_to_file = iVar3 != 0;
  std::__cxx11::string::~string(local_a18);
  std::allocator<char>::~allocator((allocator<char> *)(local_a40 + 0x27));
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a60,"Objects",&local_a61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a88,"decompilation_file_path",&local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ab0,"../Test/decompiled.replicode",&local_ab1);
  utils::IniFile::getString
            ((IniFile *)local_a40,(string *)local_50,(string *)local_a60,(string *)local_a88);
  std::__cxx11::string::operator=((string *)&this->decompilation_file_path,(string *)local_a40);
  std::__cxx11::string::~string((string *)local_a40);
  std::__cxx11::string::~string(local_ab0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
  std::__cxx11::string::~string(local_a88);
  std::allocator<char>::~allocator((allocator<char> *)&local_a89);
  std::__cxx11::string::~string(local_a60);
  std::allocator<char>::~allocator((allocator<char> *)&local_a61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ad8,"Objects",&local_ad9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b00,"ignore_named_objects",&local_b01);
  iVar3 = utils::IniFile::getBool((IniFile *)local_50,(string *)local_ad8,(string *)local_b00,false)
  ;
  this->ignore_named_objects = iVar3 != 0;
  std::__cxx11::string::~string(local_b00);
  std::allocator<char>::~allocator((allocator<char> *)&local_b01);
  std::__cxx11::string::~string(local_ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b28,"Objects",&local_b29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b50,"write_objects",(allocator *)(local_b78 + 0x27));
  iVar3 = utils::IniFile::getBool((IniFile *)local_50,(string *)local_b28,(string *)local_b50,false)
  ;
  this->write_objects = iVar3 != 0;
  std::__cxx11::string::~string(local_b50);
  std::allocator<char>::~allocator((allocator<char> *)(local_b78 + 0x27));
  std::__cxx11::string::~string(local_b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_b29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b98,"Objects",&local_b99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bc0,"objects_path",&local_bc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_be8,"objects.image",&local_be9);
  utils::IniFile::getString
            ((IniFile *)local_b78,(string *)local_50,(string *)local_b98,(string *)local_bc0);
  std::__cxx11::string::operator=((string *)&this->objects_path,(string *)local_b78);
  std::__cxx11::string::~string((string *)local_b78);
  std::__cxx11::string::~string(local_be8);
  std::allocator<char>::~allocator((allocator<char> *)&local_be9);
  std::__cxx11::string::~string(local_bc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
  std::__cxx11::string::~string(local_b98);
  std::allocator<char>::~allocator((allocator<char> *)&local_b99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c10,"Objects",&local_c11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c38,"test_objects",&local_c39);
  iVar3 = utils::IniFile::getBool((IniFile *)local_50,(string *)local_c10,(string *)local_c38,false)
  ;
  this->test_objects = iVar3 != 0;
  std::__cxx11::string::~string(local_c38);
  std::allocator<char>::~allocator((allocator<char> *)&local_c39);
  std::__cxx11::string::~string(local_c10);
  std::allocator<char>::~allocator((allocator<char> *)&local_c11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c60,"Run",&local_c61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c88,"run_time",&local_c89);
  uVar5 = utils::IniFile::getInt((IniFile *)local_50,(string *)local_c60,(string *)local_c88,0x2760)
  ;
  this->run_time = uVar5;
  std::__cxx11::string::~string(local_c88);
  std::allocator<char>::~allocator((allocator<char> *)&local_c89);
  std::__cxx11::string::~string(local_c60);
  std::allocator<char>::~allocator((allocator<char> *)&local_c61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cb0,"Run",&local_cb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cd8,"probe_level",&local_cd9);
  uVar5 = utils::IniFile::getInt((IniFile *)local_50,(string *)local_cb0,(string *)local_cd8,2);
  this->probe_level = uVar5;
  std::__cxx11::string::~string(local_cd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cd9);
  std::__cxx11::string::~string(local_cb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d00,"Models",&local_d01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d28,"get_models",&local_d29);
  iVar3 = utils::IniFile::getBool((IniFile *)local_50,(string *)local_d00,(string *)local_d28,false)
  ;
  this->get_models = iVar3 != 0;
  std::__cxx11::string::~string(local_d28);
  std::allocator<char>::~allocator((allocator<char> *)&local_d29);
  std::__cxx11::string::~string(local_d00);
  std::allocator<char>::~allocator((allocator<char> *)&local_d01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d50,"Models",&local_d51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d78,"decompile_models",&local_d79);
  iVar3 = utils::IniFile::getBool((IniFile *)local_50,(string *)local_d50,(string *)local_d78,false)
  ;
  this->decompile_models = iVar3 != 0;
  std::__cxx11::string::~string(local_d78);
  std::allocator<char>::~allocator((allocator<char> *)&local_d79);
  std::__cxx11::string::~string(local_d50);
  std::allocator<char>::~allocator((allocator<char> *)&local_d51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_da0,"Models",&local_da1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dc8,"ignore_named_models",(allocator *)(local_df0 + 0x27));
  iVar3 = utils::IniFile::getBool((IniFile *)local_50,(string *)local_da0,(string *)local_dc8,false)
  ;
  this->ignore_named_models = iVar3 != 0;
  std::__cxx11::string::~string(local_dc8);
  std::allocator<char>::~allocator((allocator<char> *)(local_df0 + 0x27));
  std::__cxx11::string::~string(local_da0);
  std::allocator<char>::~allocator((allocator<char> *)&local_da1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e10,"Models",&local_e11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e38,"models_path",&local_e39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e60,"models.image",&local_e61);
  utils::IniFile::getString
            ((IniFile *)local_df0,(string *)local_50,(string *)local_e10,(string *)local_e38);
  std::__cxx11::string::operator=((string *)&this->models_path,(string *)local_df0);
  std::__cxx11::string::~string((string *)local_df0);
  std::__cxx11::string::~string(local_e60);
  std::allocator<char>::~allocator((allocator<char> *)&local_e61);
  std::__cxx11::string::~string(local_e38);
  std::allocator<char>::~allocator((allocator<char> *)&local_e39);
  std::__cxx11::string::~string(local_e10);
  std::allocator<char>::~allocator((allocator<char> *)&local_e11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e88,"Models",&local_e89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_eb0,"write_models",&local_eb1);
  iVar3 = utils::IniFile::getBool((IniFile *)local_50,(string *)local_e88,(string *)local_eb0,false)
  ;
  this->write_models = iVar3 != 0;
  std::__cxx11::string::~string(local_eb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
  std::__cxx11::string::~string(local_e88);
  std::allocator<char>::~allocator((allocator<char> *)&local_e89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ed8,"Models",&local_ed9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f00,"test_models",&local_f01);
  iVar3 = utils::IniFile::getBool((IniFile *)local_50,(string *)local_ed8,(string *)local_f00,false)
  ;
  this->test_models = iVar3 != 0;
  std::__cxx11::string::~string(local_f00);
  std::allocator<char>::~allocator((allocator<char> *)&local_f01);
  std::__cxx11::string::~string(local_ed8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ed9);
  utils::IniFile::~IniFile((IniFile *)local_50);
  return true;
}

Assistant:

bool load(const char *file_name)
    {
        utils::IniFile settingsFile;

        if (!settingsFile.readFile(file_name)) {
            std::cerr << "Unable to load settings, using defaults";
        }

        ::debug("settings") << "Loading settings file" << file_name;
        usr_operator_path = settingsFile.getString("Load", "usr_operator_path", "../build/usr_operators/libusr_operators.so");
        usr_class_path = settingsFile.getString("Load", "usr_class_path", "./V1.2/user.classes.replicode");
        source_file_name = settingsFile.getString("Load", "source_file_name",  "./V1.2/test.2.replicode");
        unsigned int cores = std::thread::hardware_concurrency();
        ::debug("settings") << "number of CPU cores available:" << cores;
        base_period = settingsFile.getInt("Init", "base_period", 50000);
        reduction_core_count = settingsFile.getInt("Init", "reduction_core_count", (cores * 3) / 4 + 1);
        time_core_count = settingsFile.getInt("Init", "time_core_count", (cores - ((cores * 3) / 4)) + 1);
        mdl_inertia_sr_thr = settingsFile.getDouble("System", "mdl_inertia_sr_thr", 0.9);
        mdl_inertia_cnt_thr = settingsFile.getInt("System", "mdl_inertia_cnt_thr", 6);
        tpx_dsr_thr = settingsFile.getDouble("System", "tpx_dsr_thr", 0.1);
        min_sim_time_horizon = settingsFile.getInt("System", "min_sim_time_horizon", 0);
        max_sim_time_horizon = settingsFile.getInt("System", "max_sim_time_horizon", 0);
        sim_time_horizon = settingsFile.getDouble("System", "sim_time_horizon", 0.3);
        tpx_time_horizon = settingsFile.getInt("System", "tpx_time_horizon", 500000);
        perf_sampling_period = settingsFile.getInt("System", "perf_sampling_period", 250000);
        float_tolerance = settingsFile.getDouble("System", "float_tolerance", 0.00001);
        time_tolerance = settingsFile.getInt("System", "time_tolerance", 10000);
        primary_thz = settingsFile.getInt("System", "primary_thz", 3600000);
        secondary_thz = settingsFile.getInt("System", "secondary_thz", 7200000);
        this->debug = settingsFile.getBool("Debug", "debug", true);
        debug_windows = settingsFile.getInt("Debug", "debug_windows", 1);
        trace_levels = std::stoi(settingsFile.getString("Debug", "trace_levels", "CC"), nullptr, 16);
        ntf_mk_resilience = settingsFile.getInt("Resilience",  "ntf_mk_resilience", 1);
        goal_pred_success_resilience = settingsFile.getInt("Resilience", "goal_pred_success_resilience", 1000);
        get_objects = settingsFile.getBool("Objects", "get_objects", false);
        decompile_objects = settingsFile.getBool("Objects", "decompile_objects", false);
        decompile_to_file = settingsFile.getBool("Objects", "decompile_to_file", false);
        decompilation_file_path = settingsFile.getString("Objects", "decompilation_file_path", "../Test/decompiled.replicode");
        ignore_named_objects = settingsFile.getBool("Objects", "ignore_named_objects", false);
        write_objects = settingsFile.getBool("Objects", "write_objects", false);
        objects_path = settingsFile.getString("Objects", "objects_path", "objects.image");
        test_objects = settingsFile.getBool("Objects", "test_objects", false);
        run_time = settingsFile.getInt("Run", "run_time", 10080);
        probe_level = settingsFile.getInt("Run", "probe_level", 2);
        get_models = settingsFile.getBool("Models", "get_models", false);
        decompile_models = settingsFile.getBool("Models", "decompile_models", false);
        ignore_named_models = settingsFile.getBool("Models", "ignore_named_models", false);
        models_path = settingsFile.getString("Models", "models_path", "models.image");
        write_models = settingsFile.getBool("Models", "write_models", false);
        test_models = settingsFile.getBool("Models", "test_models", false);
        return true;
    }